

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_truetype.h
# Opt level: O0

stbtt__buf stbtt__cff_index_get(stbtt__buf b,int i)

{
  byte bVar1;
  stbtt_uint32 sVar2;
  uint n;
  stbtt_uint32 sVar3;
  stbtt_uint32 sVar4;
  stbtt__buf sVar5;
  int end;
  int start;
  int offsize;
  int count;
  int i_local;
  stbtt__buf b_local;
  
  b_local.data = b._8_8_;
  _count = b.data;
  stbtt__buf_seek((stbtt__buf *)&count,0);
  sVar2 = stbtt__buf_get((stbtt__buf *)&count,2);
  bVar1 = stbtt__buf_get8((stbtt__buf *)&count);
  n = (uint)bVar1;
  if (i < 0 || (int)sVar2 <= i) {
    __assert_fail("i >= 0 && i < count",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imstb_truetype.h"
                  ,0x4e1,"stbtt__buf stbtt__cff_index_get(stbtt__buf, int)");
  }
  if (n == 0 || 4 < n) {
    __assert_fail("offsize >= 1 && offsize <= 4",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imstb_truetype.h"
                  ,0x4e2,"stbtt__buf stbtt__cff_index_get(stbtt__buf, int)");
  }
  stbtt__buf_skip((stbtt__buf *)&count,i * n);
  sVar3 = stbtt__buf_get((stbtt__buf *)&count,n);
  sVar4 = stbtt__buf_get((stbtt__buf *)&count,n);
  sVar5 = stbtt__buf_range((stbtt__buf *)&count,(sVar2 + 1) * n + 2 + sVar3,sVar4 - sVar3);
  return sVar5;
}

Assistant:

static stbtt__buf stbtt__cff_index_get(stbtt__buf b, int i)
{
   int count, offsize, start, end;
   stbtt__buf_seek(&b, 0);
   count = stbtt__buf_get16(&b);
   offsize = stbtt__buf_get8(&b);
   STBTT_assert(i >= 0 && i < count);
   STBTT_assert(offsize >= 1 && offsize <= 4);
   stbtt__buf_skip(&b, i*offsize);
   start = stbtt__buf_get(&b, offsize);
   end = stbtt__buf_get(&b, offsize);
   return stbtt__buf_range(&b, 2+(count+1)*offsize+start, end - start);
}